

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int ipc_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  ipc_listener *l;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  iVar1 = nni_getopt(ipc_listener_options,name,arg,buf,szp,t);
  return iVar1;
}

Assistant:

static int
ipc_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_getopt(ipc_ep_options, name, ep, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_listener_get(ep->listener, name, buf, szp, t);
	}
	return (rv);
}